

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

optional<long_long> __thiscall
QXmlStreamReaderPrivate::fastScanName(QXmlStreamReaderPrivate *this,Value *val)

{
  long lVar1;
  uint *puVar2;
  _Storage<long_long,_true> _Var3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  optional<long_long> oVar8;
  QStringView s;
  
  _Var3._M_value = 0;
LAB_003a6dd0:
  lVar1 = (this->putStack).tos;
  if (lVar1 == -1) {
    lVar1 = this->readBufferPos;
    if (lVar1 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar1 + 1;
      uVar6 = (uint)(ushort)(this->readBuffer).d.ptr[lVar1];
    }
    else {
      uVar6 = getChar_helper(this);
    }
  }
  else {
    uVar6 = 0xffffffff;
    if (this->atEnd == false) {
      uVar6 = (this->putStack).data[lVar1];
      (this->putStack).tos = lVar1 + -1;
    }
  }
  if (uVar6 == 0xffffffff) {
    if (val != (Value *)0x0) {
      val->prefix = 0;
    }
    lVar1 = (this->textBuffer).d.size;
    lVar7 = lVar1 - (long)_Var3;
    s.m_data = (this->textBuffer).d.ptr;
    s.m_size = lVar1;
    putString(this,s,lVar7);
    QString::resize(&this->textBuffer,lVar7);
    uVar4 = 0xf8009fef00002601;
    _Var3._M_value = 0;
    goto LAB_003a705b;
  }
  if (_Var3._M_value == 0x1000) {
    raiseNamePrefixTooLongError(this);
    uVar4 = 0;
    goto LAB_003a705b;
  }
  if (0x3f < uVar6) {
LAB_003a6e64:
    if ((uVar6 - 0x5b < 0x22) && ((0x20000000dU >> ((ulong)(uVar6 - 0x5b) & 0x3f) & 1) != 0))
    goto LAB_003a6eb1;
LAB_003a6e9e:
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar6);
    _Var3._M_value = _Var3._M_value + 1;
    goto LAB_003a6dd0;
  }
  if ((ulong)uVar6 == 0x3a) {
    if ((val == (Value *)0x0) || (val->prefix != 0)) {
      lVar1 = (this->putStack).tos;
      lVar7 = (this->putStack).cap;
      if (lVar7 <= lVar1 + 1) {
        lVar1 = lVar1 + 2;
        lVar5 = lVar7 * 2;
        if (lVar1 != lVar5 && SBORROW8(lVar1,lVar5) == lVar1 + lVar7 * -2 < 0) {
          lVar5 = lVar1;
        }
        (this->putStack).cap = lVar5;
        puVar2 = (uint *)realloc((this->putStack).data,lVar5 << 2);
        (this->putStack).data = puVar2;
        if (puVar2 == (uint *)0x0) goto LAB_003a706f;
      }
      lVar1 = (this->putStack).tos;
      (this->putStack).tos = lVar1 + 1;
      (this->putStack).data[lVar1 + 1] = uVar6;
      uVar4 = 0xf8009fef00002601;
      goto LAB_003a705b;
    }
    val->prefix = (short)_Var3._M_value + 2;
    goto LAB_003a6e9e;
  }
  if ((0xf8009fef00002600U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_003a6e64;
LAB_003a6eb1:
  lVar1 = (this->putStack).tos;
  lVar7 = (this->putStack).cap;
  if (lVar7 <= lVar1 + 1) {
    lVar1 = lVar1 + 2;
    lVar5 = lVar7 * 2;
    if (lVar1 != lVar5 && SBORROW8(lVar1,lVar5) == lVar1 + lVar7 * -2 < 0) {
      lVar5 = lVar1;
    }
    (this->putStack).cap = lVar5;
    puVar2 = (uint *)realloc((this->putStack).data,lVar5 << 2);
    (this->putStack).data = puVar2;
    if (puVar2 == (uint *)0x0) goto LAB_003a706f;
  }
  puVar2 = (this->putStack).data;
  lVar1 = (this->putStack).tos;
  (this->putStack).tos = lVar1 + 1;
  puVar2[lVar1 + 1] = uVar6;
  uVar4 = 0xf8009fef00002601;
  if ((val != (Value *)0x0) && ((long)val->prefix + -1 == _Var3._M_value)) {
    val->prefix = 0;
    lVar7 = (this->putStack).cap;
    if (lVar7 <= lVar1 + 2) {
      lVar1 = lVar1 + 3;
      lVar5 = lVar7 * 2;
      if (lVar1 != lVar5 && SBORROW8(lVar1,lVar5) == lVar1 + lVar7 * -2 < 0) {
        lVar5 = lVar1;
      }
      (this->putStack).cap = lVar5;
      puVar2 = (uint *)realloc(puVar2,lVar5 << 2);
      (this->putStack).data = puVar2;
      if (puVar2 == (uint *)0x0) {
LAB_003a706f:
        qBadAlloc();
      }
    }
    lVar1 = (this->putStack).tos;
    (this->putStack).tos = lVar1 + 1;
    (this->putStack).data[lVar1 + 1] = 0x3a;
    _Var3._M_value = _Var3._M_value + -1;
  }
LAB_003a705b:
  oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = uVar4 & 0xffffffff;
  oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = _Var3._M_value;
  return (optional<long_long>)
         oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

inline std::optional<qsizetype> QXmlStreamReaderPrivate::fastScanName(Value *val)
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (n >= 4096) {
            // This is too long to be a sensible name, and
            // can exhaust memory, or the range of decltype(*prefix)
            raiseNamePrefixTooLongError();
            return std::nullopt;
        }
        switch (c) {
        case '\n':
        case ' ':
        case '\t':
        case '\r':
        case '&':
        case '#':
        case '\'':
        case '\"':
        case '<':
        case '>':
        case '[':
        case ']':
        case '=':
        case '%':
        case '/':
        case ';':
        case '?':
        case '!':
        case '^':
        case '|':
        case ',':
        case '(':
        case ')':
        case '+':
        case '*':
            putChar(c);
            if (val && val->prefix == n + 1) {
                val->prefix = 0;
                putChar(':');
                --n;
            }
            return n;
        case ':':
            if (val) {
                if (val->prefix == 0) {
                    val->prefix = qint16(n + 2);
                } else { // only one colon allowed according to the namespace spec.
                    putChar(c);
                    return n;
                }
            } else {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }

    if (val)
        val->prefix = 0;
    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    return 0;
}